

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::add
          (array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this,CScaledGlyph *item)

{
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *in_RSI;
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *in_RDI;
  
  incsize(in_RSI);
  size(in_RDI);
  set_size(in_RSI,(int)((ulong)in_RDI >> 0x20));
  memcpy(in_RDI->list + (in_RDI->num_elements + -1),in_RSI,0x3c);
  return in_RDI->num_elements + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}